

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall
QWidgetRepaintManager::markNeedsFlush(QWidgetRepaintManager *this,QWidget *widget,QRegion *region)

{
  long lVar1;
  bool bVar2;
  QWidgetPrivate *pQVar3;
  QRegion *in_RDX;
  long in_RSI;
  QListSpecialMethodsBase<QWidget_*> *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *widgetPrivate;
  parameter_type in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    pQVar3 = qt_widget_private((QWidget *)0x3a9726);
    if (pQVar3->needsFlush == (QRegion *)0x0) {
      in_stack_ffffffffffffffc8 = (parameter_type)operator_new(8);
      QRegion::QRegion((QRegion *)in_stack_ffffffffffffffc8);
      pQVar3->needsFlush = (QRegion *)in_stack_ffffffffffffffc8;
    }
    QRegion::operator+=(pQVar3->needsFlush,in_RDX);
    bVar2 = QListSpecialMethodsBase<QWidget*>::contains<QWidget*>
                      (in_RDI,(QWidget **)in_stack_ffffffffffffffc8);
    if (!bVar2) {
      QList<QWidget_*>::append((QList<QWidget_*> *)0x3a97a0,in_stack_ffffffffffffffc8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::markNeedsFlush(QWidget *widget, const QRegion &region)
{
    if (!widget)
        return;

    auto *widgetPrivate = qt_widget_private(widget);
    if (!widgetPrivate->needsFlush)
        widgetPrivate->needsFlush = new QRegion;

    *widgetPrivate->needsFlush += region;

    if (!needsFlushWidgets.contains(widget))
        needsFlushWidgets.append(widget);
}